

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void emit_GLSL_sampler(Context *ctx,int stage,TextureType ttype,int tb)

{
  uint uVar1;
  char *len;
  size_t in_R8;
  char *pcVar2;
  char var [64];
  char name [64];
  
  len = var;
  if (ttype - TEXTURE_TYPE_2D < 3) {
    pcVar2 = &DAT_0012d4bc + *(int *)(&DAT_0012d4bc + (ulong)(ttype - TEXTURE_TYPE_2D) * 4);
  }
  else {
    fail(ctx,"BUG: used a sampler we don\'t know how to define.");
    pcVar2 = "";
  }
  get_GLSL_varname_in_buf(ctx,REG_TYPE_SAMPLER,stage,var,in_R8);
  push_output(ctx,&ctx->globals);
  output_line(ctx,"uniform %s %s;",pcVar2);
  if (tb != 0) {
    uVar1 = ctx->uniform_float4_count;
    ctx->uniform_float4_count = uVar1 + 2;
    get_GLSL_uniform_array_varname(ctx,REG_TYPE_CONST,name,(size_t)len);
    output_line(ctx,"#define %s_texbem %s[%d]",var,name,(ulong)uVar1);
    output_line(ctx,"#define %s_texbeml %s[%d]",var,name,(ulong)(uVar1 + 1));
  }
  pop_output(ctx);
  return;
}

Assistant:

static void emit_GLSL_sampler(Context *ctx,int stage,TextureType ttype,int tb)
{
    const char *type = "";
    switch (ttype)
    {
        case TEXTURE_TYPE_2D: type = "sampler2D"; break;
        case TEXTURE_TYPE_CUBE: type = "samplerCube"; break;
        case TEXTURE_TYPE_VOLUME: type = "sampler3D"; break;
        default: fail(ctx, "BUG: used a sampler we don't know how to define.");
    } // switch

    char var[64];
    get_GLSL_varname_in_buf(ctx, REG_TYPE_SAMPLER, stage, var, sizeof (var));

    push_output(ctx, &ctx->globals);
    output_line(ctx, "uniform %s %s;", type, var);
    if (tb)  // This sampler used a ps_1_1 TEXBEM opcode?
    {
        char name[64];
        const int index = ctx->uniform_float4_count;
        ctx->uniform_float4_count += 2;
        get_GLSL_uniform_array_varname(ctx, REG_TYPE_CONST, name, sizeof (name));
        output_line(ctx, "#define %s_texbem %s[%d]", var, name, index);
        output_line(ctx, "#define %s_texbeml %s[%d]", var, name, index+1);
    } // if
    pop_output(ctx);
}